

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O3

bool __thiscall
TimesAll<0,0,0>::propagate_xy_max<0,0>
          (TimesAll<0,0,0> *this,IntView<0> u,IntView<0> v,int64_t v_min,int64_t v_max,int64_t z_min
          ,int64_t z_max)

{
  uint uVar1;
  int iVar2;
  Clause *in_RAX;
  long lVar3;
  IntVar *pIVar4;
  ulong uVar5;
  Clause *pCVar6;
  IntVar *pIVar7;
  Clause *pCVar8;
  ulong uVar9;
  Clause *c;
  Clause *local_38;
  
  pIVar4 = v.var;
  pIVar7 = u.var;
  if (v_max < 1 || -1 < v_min) {
    if (v_max < 0) {
      z_max = z_min;
    }
    if (z_min < 1) {
      v_min = v_max;
    }
    uVar9 = z_max / v_min;
  }
  else {
    uVar5 = -z_min;
    if (0 < z_min) {
      uVar5 = z_min;
    }
    if ((long)uVar5 <= z_max) {
      uVar5 = z_max;
    }
    uVar9 = -z_max;
    if (uVar5 != uVar9 && SBORROW8(uVar5,uVar9) == (long)(uVar5 + z_max) < 0) {
      uVar9 = uVar5;
    }
  }
  lVar3 = (long)(pIVar7->max).v;
  pCVar6 = (Clause *)0x1;
  if ((long)uVar9 < lVar3) {
    if (so.lazy) {
      local_38 = (Clause *)malloc(0x1c);
      *(uint *)local_38 = 0x502;
      vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_38);
      pCVar8 = local_38;
      uVar1 = (*(pIVar4->super_Var).super_Branching._vptr_Branching[8])(pIVar4);
      if (*(uint *)pCVar8 < 0x200) {
LAB_001ad3f1:
        abort();
      }
      *(uint *)(pCVar8 + 1) = uVar1;
      iVar2 = (*(pIVar4->super_Var).super_Branching._vptr_Branching[9])(pIVar4);
      if (*(uint *)pCVar8 < 0x300) goto LAB_001ad3f1;
      pCVar8[1].data[0].x = iVar2;
      uVar1 = (**(code **)(**(long **)(this + 0x38) + 0x40))();
      if (*(uint *)pCVar8 < 0x400) goto LAB_001ad3f1;
      *(uint *)(pCVar8 + 2) = uVar1;
      iVar2 = (**(code **)(**(long **)(this + 0x38) + 0x48))();
      if (*(uint *)pCVar8 < 0x500) goto LAB_001ad3f1;
      pCVar8[2].data[0].x = iVar2;
      lVar3 = (long)(pIVar7->max).v;
    }
    else {
      pCVar8 = (Clause *)0x0;
      local_38 = in_RAX;
    }
    uVar9 = -(ulong)(uVar9 == 0) | uVar9;
    if ((long)uVar9 < lVar3) {
      pCVar6 = (Clause *)0x0;
      if (so.lazy == false) {
        pCVar8 = pCVar6;
      }
      iVar2 = (*(pIVar7->super_Var).super_Branching._vptr_Branching[0xf])(pIVar7,uVar9,pCVar8,1);
      if ((char)iVar2 == '\0') goto LAB_001ad3e0;
    }
    pCVar6 = (Clause *)0x1;
  }
LAB_001ad3e0:
  return SUB81(pCVar6,0);
}

Assistant:

bool propagate_xy_max(IntView<U> u, IntView<V> v, const int64_t v_min, const int64_t v_max,
												const int64_t z_min, const int64_t z_max) {
		assert(z_min > 0 || z_max < 0);
		assert(v_min != 0 && v_max != 0);
		// The product z cannot be 0. Then x and y cannot be 0, too.
		// u <= floor(z / v)
		int64_t u_max_new = 0;
		if (v_min < 0 && v_max > 0) {
			// The domain of integer variable v contains -1 and 1
			u_max_new = std::max(-1 * z_min, z_min);
			u_max_new = std::max(u_max_new, z_max);
			u_max_new = std::max(u_max_new, -1 * z_max);
		} else {
			u_max_new = (v_max < 0 ? z_min : z_max) / (z_min > 0 ? v_min : v_max);
		}

		if (u_max_new < u.getMax()) {
			// TODO Better explanation
			Clause* reason = nullptr;
			if (so.lazy) {
				reason = Reason_new(5);
				(*reason)[1] = v.getMinLit();
				(*reason)[2] = v.getMaxLit();
				(*reason)[3] = z.getMinLit();
				(*reason)[4] = z.getMaxLit();
			}
			setDom(u, setMax, (u_max_new == 0 ? -1 : u_max_new), reason);
		}

		return true;
	}